

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_group_collection.cpp
# Opt level: O2

void __thiscall duckdb::TableAppendState::~TableAppendState(TableAppendState *this)

{
  Vector::~Vector(&this->hashes);
  TableStatistics::~TableStatistics(&this->stats);
  ::std::unique_lock<std::mutex>::~unique_lock(&this->append_lock);
  ::std::unique_ptr<duckdb::ColumnAppendState[],_std::default_delete<duckdb::ColumnAppendState[]>_>
  ::~unique_ptr(&(this->row_group_append_state).states.
                 super_unique_ptr<duckdb::ColumnAppendState[],_std::default_delete<duckdb::ColumnAppendState[]>_>
               );
  return;
}

Assistant:

TableAppendState::~TableAppendState() {
}